

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O2

VersionBitsTester * __thiscall
VersionBitsTester::Mine(VersionBitsTester *this,uint height,int32_t nTime,int32_t nVersion)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CBlockIndex *this_00;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while ((ulong)((long)(this->vpblock).
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->vpblock).
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < (ulong)height) {
    this_00 = (CBlockIndex *)operator_new(0x98);
    memset(this_00,0,0x98);
    CBlockIndex::CBlockIndex(this_00);
    ppCVar1 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar2 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this_00->nHeight = (int)((ulong)((long)ppCVar1 - (long)ppCVar2) >> 3);
    if (ppCVar1 == ppCVar2) {
      pCVar3 = (CBlockIndex *)0x0;
    }
    else {
      pCVar3 = ppCVar1[-1];
    }
    this_00->pprev = pCVar3;
    this_00->nTime = nTime;
    this_00->nVersion = nVersion;
    local_40 = this_00;
    CBlockIndex::BuildSkip(this_00);
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back(&this->vpblock,&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Mine(unsigned int height, int32_t nTime, int32_t nVersion) {
        while (vpblock.size() < height) {
            CBlockIndex* pindex = new CBlockIndex();
            pindex->nHeight = vpblock.size();
            pindex->pprev = Tip();
            pindex->nTime = nTime;
            pindex->nVersion = nVersion;
            pindex->BuildSkip();
            vpblock.push_back(pindex);
        }
        return *this;
    }